

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O3

CallOrCast * __thiscall
soul::PoolAllocator::
allocate<soul::AST::CallOrCast,soul::AST::QualifiedIdentifier&,soul::pool_ptr<soul::AST::CommaSeparatedList>&,bool>
          (PoolAllocator *this,QualifiedIdentifier *args,
          pool_ptr<soul::AST::CommaSeparatedList> *args_1,bool *args_2)

{
  bool bVar1;
  CommaSeparatedList *pCVar2;
  SourceCodeText *pSVar3;
  Scope *pSVar4;
  PoolItem *pPVar5;
  
  pPVar5 = allocateSpaceForObject(this,0x48);
  pCVar2 = args_1->object;
  bVar1 = *args_2;
  *(undefined4 *)&pPVar5->field_0x18 = 0x19;
  pSVar3 = (args->super_Expression).super_Statement.super_ASTObject.context.location.sourceCode.
           object;
  pPVar5[1].size = (size_t)pSVar3;
  if (pSVar3 != (SourceCodeText *)0x0) {
    (pSVar3->super_RefCountedObject).refCount = (pSVar3->super_RefCountedObject).refCount + 1;
  }
  pSVar4 = (args->super_Expression).super_Statement.super_ASTObject.context.parentScope;
  pPVar5[1].destructor =
       (DestructorFn *)
       (args->super_Expression).super_Statement.super_ASTObject.context.location.location.data;
  pPVar5[1].item = pSVar4;
  *(undefined4 *)&pPVar5[1].field_0x18 = 0;
  pPVar5[2].size = (size_t)pCVar2;
  *(bool *)&pPVar5[2].destructor = bVar1;
  pPVar5->item = &PTR__CallOrCast_002f6cd0;
  pPVar5[2].item = args;
  pPVar5->destructor =
       allocate<soul::AST::CallOrCast,_soul::AST::QualifiedIdentifier_&,_soul::pool_ptr<soul::AST::CommaSeparatedList>_&,_bool>
       ::anon_class_1_0_00000001::__invoke;
  return (CallOrCast *)&pPVar5->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }